

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::rowCoefficientsIntegral(HPresolve *this,HighsInt row,double scale)

{
  double *pdVar1;
  bool bVar2;
  reference this_00;
  long in_RDI;
  iterator *this_01;
  HighsSliceNonzero *nz;
  iterator __end1;
  iterator __begin1;
  HighsTripletTreeSlicePreOrder *__range1;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_fffffffffffffee8;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar3;
  undefined4 in_stack_ffffffffffffff24;
  iterator local_d0;
  iterator local_90;
  undefined1 local_50 [40];
  undefined1 *local_28;
  byte local_1;
  
  getRowVector((HPresolve *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  local_28 = local_50;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(in_stack_fffffffffffffef8);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end(in_stack_fffffffffffffee8);
  do {
    bVar2 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=
                      (&local_90,&local_d0);
    if (!bVar2) {
      iVar3 = 2;
LAB_006ec0bf:
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6ec0c9);
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6ec0d6);
      if (iVar3 != 1) {
        local_1 = 1;
      }
      return (bool)(local_1 & 1);
    }
    this_00 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*(&local_90);
    this_01 = (iterator *)HighsSliceNonzero::value(this_00);
    in_stack_fffffffffffffee8 =
         (HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
         fractionality<double>((double)this_01,(double *)in_stack_fffffffffffffee8);
    pdVar1 = (double *)(*(long *)(in_RDI + 8) + 0x108);
    if (*pdVar1 <= (double)in_stack_fffffffffffffee8 && (double)in_stack_fffffffffffffee8 != *pdVar1
       ) {
      local_1 = 0;
      iVar3 = 1;
      goto LAB_006ec0bf;
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(this_01);
  } while( true );
}

Assistant:

bool HPresolve::rowCoefficientsIntegral(HighsInt row, double scale) const {
  for (const HighsSliceNonzero& nz : getRowVector(row)) {
    if (fractionality(nz.value() * scale) > options->small_matrix_value)
      return false;
  }

  return true;
}